

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestPath.cpp
# Opt level: O1

string * __thiscall
CppUnit::TestPath::toString_abi_cxx11_(string *__return_storage_ptr__,TestPath *this)

{
  int iVar1;
  undefined4 extraout_var;
  uint uVar2;
  long *local_58 [2];
  long local_48 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_38;
  
  local_38 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_38;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"/","");
  uVar2 = 0;
  while( true ) {
    iVar1 = (*this->_vptr_TestPath[10])(this);
    if (iVar1 <= (int)uVar2) break;
    if (uVar2 != 0) {
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
    }
    iVar1 = (*this->_vptr_TestPath[0xb])(this,(ulong)uVar2);
    (**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0x30))
              (local_58,(long *)CONCAT44(extraout_var,iVar1));
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_58[0]);
    if (local_58[0] != local_48) {
      operator_delete(local_58[0],local_48[0] + 1);
    }
    uVar2 = uVar2 + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

std::string 
TestPath::toString() const
{
  std::string asString( "/" );
  for ( int index =0; index < getTestCount(); ++index )
  {
    if ( index > 0 )
      asString += '/';
    asString += getTestAt(index)->getName();
  }

  return asString;
}